

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O1

void ripemd160_done(ripemd160_ctx *ctx,ripemd160 *res)

{
  long lVar1;
  uint64_t sizedesc;
  long local_20;
  
  local_20 = ctx->bytes * 8;
  add(ctx,ripemd160_done::pad,(ulong)(0x37U - (int)ctx->bytes & 0x3f) + 1);
  add(ctx,&local_20,8);
  lVar1 = 0;
  do {
    (res->u).u32[lVar1] = ctx->s[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  ctx->bytes = 0xffffffffffffffff;
  return;
}

Assistant:

void ripemd160_done(struct ripemd160_ctx *ctx, struct ripemd160 *res)
{
	static const unsigned char pad[64] = {0x80};
	uint64_t sizedesc;
	size_t i;

	sizedesc = cpu_to_le64(ctx->bytes << 3);
	/* Add '1' bit to terminate, then all 0 bits, up to next block - 8. */
	add(ctx, pad, 1 + ((119 - (ctx->bytes % 64)) % 64));
	/* Add number of bits of data (big endian) */
	add(ctx, &sizedesc, 8);
	for (i = 0; i < sizeof(ctx->s) / sizeof(ctx->s[0]); i++)
		res->u.u32[i] = cpu_to_le32(ctx->s[i]);
	invalidate_ripemd160(ctx);
}